

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

void __thiscall cmListFileBacktrace::PrintTitle(cmListFileBacktrace *this,ostream *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *remote_path;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Entry *pEVar3;
  pointer pcVar4;
  bool bVar5;
  cmState *pcVar6;
  char *pcVar7;
  cmListFileContext lfc;
  cmOutputConverter converter;
  allocator local_d9;
  cmListFileContext local_d8;
  string local_90;
  string local_70;
  cmOutputConverter local_50;
  
  if (this->Cur != (Entry *)0x0) {
    cmOutputConverter::cmOutputConverter(&local_50,&this->Bottom);
    pEVar3 = this->Cur;
    paVar1 = &local_d8.Name.field_2;
    pcVar4 = (pEVar3->super_cmListFileContext).Name._M_dataplus._M_p;
    local_d8.Name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar4,
               pcVar4 + (pEVar3->super_cmListFileContext).Name._M_string_length);
    remote_path = &local_d8.FilePath;
    paVar2 = &local_d8.FilePath.field_2;
    pcVar4 = (pEVar3->super_cmListFileContext).FilePath._M_dataplus._M_p;
    local_d8.FilePath._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)remote_path,pcVar4,
               pcVar4 + (pEVar3->super_cmListFileContext).FilePath._M_string_length);
    local_d8.Line = (pEVar3->super_cmListFileContext).Line;
    pcVar6 = cmStateSnapshot::GetState(&this->Bottom);
    bVar5 = cmState::GetIsInTryCompile(pcVar6);
    if (!bVar5) {
      pcVar6 = cmStateSnapshot::GetState(&this->Bottom);
      pcVar7 = cmState::GetSourceDirectory(pcVar6);
      std::__cxx11::string::string((string *)&local_90,pcVar7,&local_d9);
      cmOutputConverter::ConvertToRelativePath(&local_70,&local_50,&local_90,remote_path);
      std::__cxx11::string::operator=((string *)remote_path,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar7 = " at ";
    if (local_d8.Line == 0) {
      pcVar7 = " in ";
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar7,4);
    operator<<(out,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.FilePath._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8.FilePath._M_dataplus._M_p,
                      local_d8.FilePath.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.Name._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8.Name._M_dataplus._M_p,local_d8.Name.field_2._M_allocated_capacity + 1
                     );
    }
  }
  return;
}

Assistant:

void cmListFileBacktrace::PrintTitle(std::ostream& out) const
{
  if (!this->Cur) {
    return;
  }
  cmOutputConverter converter(this->Bottom);
  cmListFileContext lfc = *this->Cur;
  if (!this->Bottom.GetState()->GetIsInTryCompile()) {
    lfc.FilePath = converter.ConvertToRelativePath(
      this->Bottom.GetState()->GetSourceDirectory(), lfc.FilePath);
  }
  out << (lfc.Line ? " at " : " in ") << lfc;
}